

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<YeeGridTest3d_GetCellIndex_Test>::CreateTest
          (TestFactoryImpl<YeeGridTest3d_GetCellIndex_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x58);
  YeeGridTest3d_GetCellIndex_Test::YeeGridTest3d_GetCellIndex_Test
            ((YeeGridTest3d_GetCellIndex_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }